

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

void __thiscall
p2t::Sweep::FillRightBelowEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Point *pPVar1;
  Point *pPVar2;
  double dVar3;
  double dVar4;
  Point *pPVar5;
  double dVar6;
  
  pPVar5 = node->point;
  dVar6 = pPVar5->x;
  if (dVar6 < edge->p->x) {
    do {
      pPVar1 = node->next->point;
      pPVar2 = node->next->next->point;
      dVar3 = pPVar2->x;
      dVar4 = pPVar2->y;
      dVar6 = (pPVar1->y - dVar4) * (dVar6 - dVar3) - (pPVar1->x - dVar3) * (pPVar5->y - dVar4);
      if ((1e-12 <= ABS(dVar6)) && (0.0 < dVar6)) {
        FillRightConcaveEdgeEvent(this,tcx,edge,node);
        return;
      }
      FillRightConvexEdgeEvent(this,tcx,edge,node);
      pPVar5 = node->point;
      dVar6 = pPVar5->x;
    } while (dVar6 < edge->p->x);
  }
  return;
}

Assistant:

void Sweep::FillRightBelowEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  if (node.point->x < edge->p->x) {
    if (Orient2d(*node.point, *node.next->point, *node.next->next->point) == CCW) {
      // Concave
      FillRightConcaveEdgeEvent(tcx, edge, node);
    } else{
      // Convex
      FillRightConvexEdgeEvent(tcx, edge, node);
      // Retry this one
      FillRightBelowEdgeEvent(tcx, edge, node);
    }
  }
}